

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgettextcontrol.cpp
# Opt level: O2

void __thiscall QWidgetTextControl::print(QWidgetTextControl *this,QPagedPaintDevice *printer)

{
  char cVar1;
  QSizeF *this_00;
  long lVar2;
  long lVar3;
  QSizeF *pQVar4;
  long in_FS_OFFSET;
  QTextDocumentFragment local_60 [8];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (printer != (QPagedPaintDevice *)0x0) {
    pQVar4 = *(QSizeF **)(*(long *)(this + 8) + 0x78);
    if (*(char *)(*(long *)(printer + 0x10) + 0x11) == '\x01') {
      cVar1 = QTextCursor::hasSelection();
      if (cVar1 == '\0') goto LAB_00482bad;
      this_00 = (QSizeF *)operator_new(0x10);
      QTextDocument::QTextDocument((QTextDocument *)this_00,(QObject *)pQVar4);
      QTextDocument::resourceProvider();
      QTextDocument::setResourceProvider((function *)this_00);
      if ((code *)local_58.size != (code *)0x0) {
        (*(code *)local_58.size)(&local_58,&local_58,3);
      }
      QTextDocument::metaInformation((MetaInformation)&local_58);
      QTextDocument::setMetaInformation((MetaInformation)this_00,(QString *)0x0);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
      local_58.d = (Data *)QTextDocument::pageSize();
      QTextDocument::setPageSize(this_00);
      QTextDocument::defaultFont();
      QTextDocument::setDefaultFont((QFont *)this_00);
      QFont::~QFont((QFont *)&local_58);
      QTextDocument::useDesignMetrics();
      QTextDocument::setUseDesignMetrics(SUB81(this_00,0));
      QTextCursor::QTextCursor((QTextCursor *)&local_58,(QTextDocument *)this_00);
      QTextCursor::selection();
      QTextCursor::insertFragment((QTextDocumentFragment *)&local_58);
      QTextDocumentFragment::~QTextDocumentFragment(local_60);
      QTextCursor::~QTextCursor((QTextCursor *)&local_58);
      lVar2 = QTextDocument::documentLayout();
      lVar2 = *(long *)(lVar2 + 8);
      lVar3 = QTextDocument::documentLayout();
      QHash<int,_QTextObjectHandler>::operator=
                ((QHash<int,_QTextObjectHandler> *)(*(long *)(lVar3 + 8) + 0x78),
                 (QHash<int,_QTextObjectHandler> *)(lVar2 + 0x78));
      pQVar4 = this_00;
    }
    else {
      this_00 = (QSizeF *)0x0;
    }
    QTextDocument::print((QPagedPaintDevice *)pQVar4);
    if (this_00 != (QSizeF *)0x0) {
      (**(code **)((long)this_00->wd + 0x20))(this_00);
    }
  }
LAB_00482bad:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetTextControl::print(QPagedPaintDevice *printer) const
{
    Q_D(const QWidgetTextControl);
    if (!printer)
        return;
    QTextDocument *tempDoc = nullptr;
    const QTextDocument *doc = d->doc;
    if (QPagedPaintDevicePrivate::get(printer)->printSelectionOnly) {
        if (!d->cursor.hasSelection())
            return;
        tempDoc = new QTextDocument(const_cast<QTextDocument *>(doc));
        tempDoc->setResourceProvider(doc->resourceProvider());
        tempDoc->setMetaInformation(QTextDocument::DocumentTitle, doc->metaInformation(QTextDocument::DocumentTitle));
        tempDoc->setPageSize(doc->pageSize());
        tempDoc->setDefaultFont(doc->defaultFont());
        tempDoc->setUseDesignMetrics(doc->useDesignMetrics());
        QTextCursor(tempDoc).insertFragment(d->cursor.selection());
        doc = tempDoc;

        // copy the custom object handlers
        doc->documentLayout()->d_func()->handlers = d->doc->documentLayout()->d_func()->handlers;
    }
    doc->print(printer);
    delete tempDoc;
}